

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar1 == -1) {
    __a1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_60 + 8);
    local_60.super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
    _M_head_impl = (_Head_base<1UL,_const_char_*,_false>)"";
    std::__cxx11::string::string((string *)__a1,(string *)arg);
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string,char_const*>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               &local_60);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)arg);
    std::__cxx11::string::substr((ulong)&local_38,(ulong)arg);
    __a1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,__a1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)__a1);
  return __return_storage_ptr__;
}

Assistant:

inline auto split_option( text arg ) -> std::tuple<text, text>
{
    auto pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_tuple( arg, "" )
                : std::make_tuple( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}